

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O3

string * __thiscall
libcellml::XmlNode::convertToStrippedString_abi_cxx11_(string *__return_storage_ptr__,XmlNode *this)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  pointer pcVar7;
  char *pcVar8;
  pointer pcVar9;
  char *pcVar10;
  pointer pcVar11;
  
  convertToString_abi_cxx11_(__return_storage_ptr__,this);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar6 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar2 + uVar6;
  pcVar8 = pcVar2;
  if (0 < (long)uVar6 >> 2) {
    pcVar8 = pcVar2 + (uVar6 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar6 >> 2) + 1;
    pcVar10 = pcVar2 + 3;
    do {
      iVar4 = isspace((int)pcVar10[-3]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0028b2f4;
      }
      iVar4 = isspace((int)pcVar10[-2]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0028b2f4;
      }
      iVar4 = isspace((int)pcVar10[-1]);
      if (iVar4 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0028b2f4;
      }
      iVar4 = isspace((int)*pcVar10);
      if (iVar4 == 0) goto LAB_0028b2f4;
      lVar5 = lVar5 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)pcVar8;
  if (lVar5 == 1) {
LAB_0028b2d0:
    iVar4 = isspace((int)*pcVar8);
    pcVar10 = pcVar8;
    if (iVar4 != 0) {
      pcVar10 = pcVar1;
    }
LAB_0028b2f4:
    if (pcVar1 == pcVar10) goto LAB_0028b30b;
    std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,0);
  }
  else {
    if (lVar5 == 2) {
LAB_0028b2bf:
      iVar4 = isspace((int)*pcVar8);
      pcVar10 = pcVar8;
      if (iVar4 != 0) {
        pcVar8 = pcVar8 + 1;
        goto LAB_0028b2d0;
      }
      goto LAB_0028b2f4;
    }
    if (lVar5 == 3) {
      iVar4 = isspace((int)*pcVar8);
      pcVar10 = pcVar8;
      if (iVar4 != 0) {
        pcVar8 = pcVar8 + 1;
        goto LAB_0028b2bf;
      }
      goto LAB_0028b2f4;
    }
LAB_0028b30b:
    __return_storage_ptr__->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar6 = __return_storage_ptr__->_M_string_length;
  pcVar9 = pcVar3 + uVar6;
  lVar5 = (long)uVar6 >> 2;
  pcVar11 = pcVar9;
  if (0 < lVar5) {
    pcVar11 = pcVar9 + -(uVar6 & 0xfffffffffffffffc);
    pcVar9 = pcVar9 + lVar5 * -4;
    lVar5 = lVar5 + 1;
    do {
      iVar4 = isspace((int)pcVar3[uVar6 - 1]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + uVar6;
        goto LAB_0028b431;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 2]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 1);
        goto LAB_0028b431;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 3]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 2);
        goto LAB_0028b431;
      }
      iVar4 = isspace((int)pcVar3[uVar6 - 4]);
      if (iVar4 == 0) {
        pcVar7 = pcVar3 + (uVar6 - 3);
        goto LAB_0028b431;
      }
      uVar6 = uVar6 - 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar11 - (long)pcVar3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar7 = pcVar3;
      if ((lVar5 != 3) || (iVar4 = isspace((int)pcVar11[-1]), pcVar7 = pcVar11, iVar4 == 0))
      goto LAB_0028b431;
      pcVar11 = pcVar9 + -1;
      pcVar9 = pcVar11;
    }
    iVar4 = isspace((int)pcVar11[-1]);
    pcVar7 = pcVar11;
    if (iVar4 == 0) goto LAB_0028b431;
    pcVar11 = pcVar9 + -1;
  }
  iVar4 = isspace((int)pcVar11[-1]);
  pcVar7 = pcVar11;
  if (iVar4 != 0) {
    pcVar7 = pcVar3;
  }
LAB_0028b431:
  __return_storage_ptr__->_M_string_length = (long)pcVar7 - (long)pcVar3;
  *pcVar7 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string XmlNode::convertToStrippedString() const
{
    std::string contentString = convertToString();
    contentString.erase(contentString.begin(), find_if_not(contentString.begin(), contentString.end(), [](int c) { return isspace(c); }));
    contentString.erase(find_if_not(contentString.rbegin(), contentString.rend(), [](int c) { return isspace(c); }).base(), contentString.end());
    return contentString;
}